

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::DebuggerScope::Dump(DebuggerScope *this)

{
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar1;
  DebuggerScopeProperty *pDVar2;
  DebuggerScope *currentDebuggerScope;
  DebuggerScope *pDVar3;
  PCWSTR pWVar4;
  ThreadContext *this_00;
  PropertyRecord *pPVar5;
  int column;
  char16_t *pcVar6;
  long lVar7;
  int i;
  long lVar8;
  
  column = -4;
  pDVar3 = this;
  do {
    pDVar3 = (pDVar3->parentScope).ptr;
    column = column + 4;
  } while (pDVar3 != (DebuggerScope *)0x0);
  pWVar4 = GetDebuggerScopeTypeString(this,this->scopeType);
  Output::Print(column,
                L"Begin scope: Address: %p Type: %s Location: %d Sibling: %p Range: [%d, %d]\n ",
                this,pWVar4,(ulong)this->scopeLocation,(this->siblingScope).ptr,
                (ulong)(uint)(this->range).begin,(ulong)(uint)(this->range).end);
  pLVar1 = (this->scopeProperties).ptr;
  if ((pLVar1 != (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)0x0) &&
     (0 < (pLVar1->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>)
          .count)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      pDVar2 = (pLVar1->
               super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
               buffer.ptr;
      this_00 = ThreadContext::GetContextForCurrentThread();
      pPVar5 = ThreadContext::GetPropertyName
                         (this_00,*(PropertyId *)((long)&pDVar2->propId + lVar7));
      pcVar6 = L"true";
      if ((*(byte *)((long)&pDVar2->flags + lVar7) & 1) == 0) {
        pcVar6 = L"false";
      }
      Output::Print(column,L"%s(%d) Location: %d Const: %s Initialized: %d\n",pPVar5 + 1,
                    (ulong)*(uint *)((long)&pDVar2->propId + lVar7),
                    (ulong)*(uint *)((long)&pDVar2->location + lVar7),pcVar6,
                    (ulong)*(uint *)((long)&pDVar2->byteCodeInitializationOffset + lVar7));
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar8 < (pLVar1->
                     super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>
                     ).count);
  }
  Output::Print(L"\n");
  return;
}

Assistant:

void DebuggerScope::Dump()
    {
        int indent = (GetScopeDepth() - 1) * 4;

        Output::Print(indent, _u("Begin scope: Address: %p Type: %s Location: %d Sibling: %p Range: [%d, %d]\n "), this, GetDebuggerScopeTypeString(scopeType), scopeLocation, PointerValue(this->siblingScope), range.begin, range.end);
        if (this->HasProperties())
        {
            this->scopeProperties->Map( [=] (int i, Js::DebuggerScopeProperty& scopeProperty) {
                Output::Print(indent, _u("%s(%d) Location: %d Const: %s Initialized: %d\n"), ThreadContext::GetContextForCurrentThread()->GetPropertyName(scopeProperty.propId)->GetBuffer(),
                    scopeProperty.propId, scopeProperty.location, scopeProperty.IsConst() ? _u("true"): _u("false"), scopeProperty.byteCodeInitializationOffset);
            });
        }

        Output::Print(_u("\n"));
    }